

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

void __thiscall
t_js_generator::generate_deserialize_container
          (t_js_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int *piVar1;
  t_type *type;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  string *prefix_00;
  string i;
  string rtmp3;
  string size;
  t_field fsize;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  t_field local_e0;
  
  std::__cxx11::string::string((string *)&local_160,"_size",(allocator *)&local_e0);
  t_generator::tmp(&local_240,(t_generator *)this,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string((string *)&local_180,"_rtmp3",(allocator *)&local_e0);
  t_generator::tmp(&local_260,(t_generator *)this,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  type = g_type_i32;
  std::__cxx11::string::string((string *)&local_1a0,(string *)&local_240);
  t_field::t_field(&local_e0,type,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_2c0);
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3," = [];");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_2a0);
      poVar3 = std::operator<<(poVar3,(string *)&this->js_const_type_);
      poVar3 = std::operator<<(poVar3,(string *)&local_260);
      poVar3 = std::operator<<(poVar3," = input.readSetBegin();");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_280);
      poVar3 = std::operator<<(poVar3,(string *)&this->js_const_type_);
      poVar3 = std::operator<<(poVar3,(string *)&local_240);
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = std::operator<<(poVar3,(string *)&local_260);
      poVar3 = std::operator<<(poVar3,".size || 0;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_00233ba5:
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      goto LAB_00233bb9;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_2c0);
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3," = [];");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_2a0);
      poVar3 = std::operator<<(poVar3,(string *)&this->js_const_type_);
      poVar3 = std::operator<<(poVar3,(string *)&local_260);
      poVar3 = std::operator<<(poVar3," = input.readListBegin();");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_280);
      poVar3 = std::operator<<(poVar3,(string *)&this->js_const_type_);
      poVar3 = std::operator<<(poVar3,(string *)&local_240);
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = std::operator<<(poVar3,(string *)&local_260);
      poVar3 = std::operator<<(poVar3,".size || 0;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_00233ba5;
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_2c0);
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3," = {};");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2c0);
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_2c0);
    poVar3 = std::operator<<(poVar3,(string *)&this->js_const_type_);
    poVar3 = std::operator<<(poVar3,(string *)&local_260);
    poVar3 = std::operator<<(poVar3," = input.readMapBegin();");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2c0);
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_2c0);
    poVar3 = std::operator<<(poVar3,(string *)&this->js_const_type_);
    poVar3 = std::operator<<(poVar3,(string *)&local_240);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)&local_260);
    poVar3 = std::operator<<(poVar3,".size || 0;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_00233bb9:
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  std::__cxx11::string::string((string *)&local_1c0,"_i",(allocator *)&local_2a0);
  t_generator::tmp(&local_2c0,(t_generator *)this,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"for (");
  poVar3 = std::operator<<(poVar3,(string *)&this->js_let_type_);
  poVar3 = std::operator<<(poVar3,(string *)&local_2c0);
  poVar3 = std::operator<<(poVar3," = 0; ");
  poVar3 = std::operator<<(poVar3,(string *)&local_2c0);
  poVar3 = std::operator<<(poVar3," < ");
  poVar3 = std::operator<<(poVar3,(string *)&local_240);
  poVar3 = std::operator<<(poVar3,"; ++");
  poVar3 = std::operator<<(poVar3,(string *)&local_2c0);
  poVar3 = std::operator<<(poVar3,") {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      prefix_00 = &local_120;
      std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,prefix_00);
      goto LAB_00233ee9;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      prefix_00 = &local_140;
      std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
      generate_deserialize_list_element(this,out,(t_list *)ttype,prefix_00);
      goto LAB_00233ee9;
    }
  }
  else {
    if (this->gen_node_ == false) {
      t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_2a0);
      poVar3 = std::operator<<(poVar3,"if (");
      poVar3 = std::operator<<(poVar3,(string *)&local_2c0);
      poVar3 = std::operator<<(poVar3," > 0 ) {");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_280);
      poVar3 = std::operator<<(poVar3,
                               "  if (input.rstack.length > input.rpos[input.rpos.length -1] + 1) {"
                              );
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
      poVar3 = std::operator<<(poVar3,"    input.rstack.pop();");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_200,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_200);
      poVar3 = std::operator<<(poVar3,"  }");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_220);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    prefix_00 = &local_100;
    std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,prefix_00);
LAB_00233ee9:
    std::__cxx11::string::~string((string *)prefix_00);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') goto LAB_00233f77;
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "input.readListEnd();";
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "input.readSetEnd();";
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    pcVar4 = "input.readMapEnd();";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_00233f77:
  std::__cxx11::string::~string((string *)&local_2c0);
  t_field::~t_field(&local_e0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  return;
}

Assistant:

void t_js_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  string size = tmp("_size");
  string rtmp3 = tmp("_rtmp3");

  t_field fsize(g_type_i32, size);

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << prefix << " = {};" << endl;

    out << indent() << js_const_type_ << rtmp3 << " = input.readMapBegin();" << endl;
    out << indent() << js_const_type_ << size << " = " << rtmp3 << ".size || 0;" << endl;

  } else if (ttype->is_set()) {

    out << indent() << prefix << " = [];" << endl
        << indent() << js_const_type_ << rtmp3 << " = input.readSetBegin();" << endl
        << indent() << js_const_type_ << size << " = " << rtmp3 << ".size || 0;" << endl;

  } else if (ttype->is_list()) {

    out << indent() << prefix << " = [];" << endl
        << indent() << js_const_type_ << rtmp3 << " = input.readListBegin();" << endl
        << indent() << js_const_type_ << size << " = " << rtmp3 << ".size || 0;" << endl;
  }

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for (" << js_let_type_ << i << " = 0; " << i << " < " << size << "; ++" << i << ") {" << endl;

  indent_up();

  if (ttype->is_map()) {
    if (!gen_node_) {
      out << indent() << "if (" << i << " > 0 ) {" << endl << indent()
          << "  if (input.rstack.length > input.rpos[input.rpos.length -1] + 1) {" << endl
          << indent() << "    input.rstack.pop();" << endl << indent() << "  }" << endl << indent()
          << "}" << endl;
    }

    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  scope_down(out);

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "input.readMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "input.readSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "input.readListEnd();" << endl;
  }
}